

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET mpp_dec_update_cfg(MppDecImpl *p)

{
  MppDecStatusCfg *status;
  MppDecBaseCfg *base;
  MppDecCfgSet *cfg;
  MppDecImpl *p_local;
  
  if (((((p->cfg).status.hal_task_count != 0) && ((p->cfg).status.hal_support_fast_mode == 0)) &&
      (p->parser_fast_mode == 0)) && ((p->cfg).base.fast_parse != 0)) {
    _mpp_log_l(2,"mpp_dec","can not enable fast parse while hal not support\n",(char *)0x0);
    (p->cfg).base.fast_parse = 0;
  }
  p->parser_fast_mode = (p->cfg).base.fast_parse;
  p->enable_deinterlace = (p->cfg).base.enable_vproc;
  p->disable_error = (p->cfg).base.disable_error;
  p->dis_err_clr_mark = (p->cfg).base.dis_err_clr_mark;
  mpp_env_get_u32("enable_deinterlace",&p->enable_deinterlace,(p->cfg).base.enable_vproc);
  return MPP_OK;
}

Assistant:

static MPP_RET mpp_dec_update_cfg(MppDecImpl *p)
{
    MppDecCfgSet *cfg = &p->cfg;
    MppDecBaseCfg *base = &cfg->base;
    MppDecStatusCfg *status = &cfg->status;

    if (status->hal_task_count && !status->hal_support_fast_mode) {
        if (!p->parser_fast_mode && base->fast_parse) {
            mpp_err("can not enable fast parse while hal not support\n");
            base->fast_parse = 0;
        }
    }

    p->parser_fast_mode     = base->fast_parse;
    p->enable_deinterlace   = base->enable_vproc;
    p->disable_error        = base->disable_error;
    p->dis_err_clr_mark     = base->dis_err_clr_mark;

    mpp_env_get_u32("enable_deinterlace", &p->enable_deinterlace, base->enable_vproc);

    return MPP_OK;
}